

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemClearAndResize(Mem *pMem,int szNew)

{
  int szNew_local;
  Mem *pMem_local;
  
  if (pMem->szMalloc < szNew) {
    pMem_local._4_4_ = sqlite3VdbeMemGrow(pMem,szNew,0);
  }
  else {
    pMem->z = pMem->zMalloc;
    pMem->flags = pMem->flags & 0xd;
    pMem_local._4_4_ = 0;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemClearAndResize(Mem *pMem, int szNew){
  assert( szNew>0 );
  assert( (pMem->flags & MEM_Dyn)==0 || pMem->szMalloc==0 );
  if( pMem->szMalloc<szNew ){
    return sqlite3VdbeMemGrow(pMem, szNew, 0);
  }
  assert( (pMem->flags & MEM_Dyn)==0 );
  pMem->z = pMem->zMalloc;
  pMem->flags &= (MEM_Null|MEM_Int|MEM_Real);
  return SQLITE_OK;
}